

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> * __thiscall
deqp::gls::BuiltinPrecisionTests::
MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Transpose>::createCase
          (MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_> *__return_storage_ptr__,
          MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Transpose> *this,
          Context *ctx)

{
  TestContext *testCtx;
  TestCaseGroup *pTVar1;
  char *name;
  char *description;
  DefaultDeleter<tcu::TestNode> local_35 [13];
  TestCaseGroup *local_28;
  TestCaseGroup *group;
  Context *ctx_local;
  MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Transpose> *this_local;
  
  group = (TestCaseGroup *)ctx;
  ctx_local = (Context *)this;
  this_local = (MatrixFuncCaseFactory<deqp::gls::BuiltinPrecisionTests::Functions::Transpose> *)
               __return_storage_ptr__;
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  testCtx = (TestContext *)(group->super_TestNode).m_name.field_2._M_allocated_capacity;
  name = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,name,description);
  local_28 = pTVar1;
  addCase<2,2>(this,(Context *)group,pTVar1);
  addCase<3,2>(this,(Context *)group,local_28);
  addCase<4,2>(this,(Context *)group,local_28);
  addCase<2,3>(this,(Context *)group,local_28);
  addCase<3,3>(this,(Context *)group,local_28);
  addCase<4,3>(this,(Context *)group,local_28);
  addCase<2,4>(this,(Context *)group,local_28);
  addCase<3,4>(this,(Context *)group,local_28);
  addCase<4,4>(this,(Context *)group,local_28);
  pTVar1 = local_28;
  de::DefaultDeleter<tcu::TestNode>::DefaultDeleter(local_35);
  de::details::MovePtr<tcu::TestNode,_de::DefaultDeleter<tcu::TestNode>_>::MovePtr
            (__return_storage_ptr__,pTVar1);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<TestNode>	createCase		(const Context& ctx) const
	{
		TestCaseGroup*	const group = new TestCaseGroup(ctx.testContext,
														ctx.name.c_str(), ctx.name.c_str());

		this->addCase<2, 2>(ctx, group);
		this->addCase<3, 2>(ctx, group);
		this->addCase<4, 2>(ctx, group);
		this->addCase<2, 3>(ctx, group);
		this->addCase<3, 3>(ctx, group);
		this->addCase<4, 3>(ctx, group);
		this->addCase<2, 4>(ctx, group);
		this->addCase<3, 4>(ctx, group);
		this->addCase<4, 4>(ctx, group);

		return MovePtr<TestNode>(group);
	}